

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int parse_match_net(vec *vec,usa *sa,int no_strict)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ushort **ppuVar6;
  uint uVar7;
  long lVar8;
  char *__s;
  ulong uVar9;
  byte *pbVar10;
  int *piVar11;
  int n;
  uint slash;
  uint c;
  uint d;
  uint b;
  uint a;
  char ad [50];
  sockaddr_in6 sin6;
  
  piVar11 = &n;
  iVar3 = __isoc99_sscanf(vec->ptr,"%u.%u.%u.%u/%u%n",&a,&b,&c,&d,&slash,&n);
  if (iVar3 == 5) {
LAB_00118e46:
    if ((0 < (long)n) && (vec->len == (long)n)) {
      if (0x20 < slash || ((0xff < d || 0xff < c) || (0xff < b || 0xff < a))) {
        return -1;
      }
      if ((sa->sa).sa_family == 2) {
        uVar4 = (sa->sin6).sin6_flowinfo;
        uVar7 = -1 << (-(char)slash & 0x1fU);
        if (slash == 0) {
          uVar7 = 0;
        }
        return (uint)((uVar7 & (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                               uVar4 << 0x18)) == (c << 8 | d | b << 0x10 | a << 0x18));
      }
      return 0;
    }
  }
  else {
    slash = 0x20;
    iVar3 = __isoc99_sscanf(vec->ptr,"%u.%u.%u.%u%n",&a,&b,&c,&d,&n,piVar11);
    if (iVar3 == 4) goto LAB_00118e46;
    n = 0;
  }
  pbVar10 = (byte *)ad;
  iVar3 = __isoc99_sscanf(vec->ptr,"[%49[^]]]/%u%n",pbVar10,&slash);
  if (iVar3 != 2) {
    slash = 0x80;
    iVar3 = __isoc99_sscanf(vec->ptr,"[%49[^]]]%n",ad,&n);
    if (iVar3 != 1) {
      n = 0;
    }
  }
  if (no_strict != 0 && n < 1) {
    __s = vec->ptr;
    pcVar5 = strchr(__s,0x2f);
    uVar9 = vec->len;
    if (pcVar5 < __s + uVar9 && pcVar5 != (char *)0x0) {
      if (0x31 < (ulong)((long)pcVar5 - (long)__s)) {
        return -1;
      }
      iVar3 = __isoc99_sscanf(pcVar5,"/%u%n",&slash,&n);
      if (iVar3 != 1) {
        return -1;
      }
      __s = vec->ptr;
      uVar9 = (long)pcVar5 - (long)__s;
      n = n + (int)uVar9;
    }
    else {
      if (0x31 < uVar9) goto LAB_00118ff4;
      n = (int)uVar9;
      slash = 0x80;
    }
    mg_strlcpy(ad,__s,uVar9 + 1);
  }
LAB_00118ff4:
  if (((0 < n) && (vec->len == (ulong)(uint)n)) && (slash < 0x81)) {
    c = 0;
    ppuVar6 = __ctype_b_loc();
    uVar4 = 0;
    while (((bVar1 = *pbVar10, ((*ppuVar6)[bVar1] >> 0xc & 1) != 0 || (bVar1 == 0x3a)) ||
           (bVar1 == 0x2e))) {
      pbVar10 = pbVar10 + 1;
      if (bVar1 == 0x3a) {
        uVar4 = uVar4 + 1;
        c = uVar4;
      }
    }
    if (1 < uVar4 && bVar1 == 0) {
      if ((sa->sa).sa_family == 10) {
        iVar3 = mg_inet_pton(10,ad,&sin6,0x1c,0);
        if (iVar3 == 0) {
          return -1;
        }
        lVar8 = 0;
        uVar9 = 0;
        do {
          if (lVar8 == 0x10) {
            return 1;
          }
          uVar4 = 0xff;
          if (((ulong)slash <= uVar9 + 8) && (uVar4 = 0, uVar9 < slash)) {
            uVar4 = 0xff << ((char)uVar9 + ('\b' - (char)slash) & 0x1fU);
          }
          lVar2 = lVar8 + 8;
          pbVar10 = sin6.sin6_addr.__in6_u.__u6_addr8 + lVar8;
          lVar8 = lVar8 + 1;
          uVar9 = uVar9 + 8;
        } while ((*(byte *)((long)sa + lVar2) & uVar4) == (uint)*pbVar10);
      }
      return 0;
    }
  }
  return -1;
}

Assistant:

static int
parse_match_net(const struct vec *vec, const union usa *sa, int no_strict)
{
	int n;
	unsigned int a, b, c, d, slash;

	if (sscanf(vec->ptr, "%u.%u.%u.%u/%u%n", &a, &b, &c, &d, &slash, &n)
	    != 5) { // NOLINT(cert-err34-c) 'sscanf' used to convert a string to an
		        // integer value, but function will not report conversion
		        // errors; consider using 'strtol' instead
		slash = 32;
		if (sscanf(vec->ptr, "%u.%u.%u.%u%n", &a, &b, &c, &d, &n)
		    != 4) { // NOLINT(cert-err34-c) 'sscanf' used to convert a string to
			        // an integer value, but function will not report conversion
			        // errors; consider using 'strtol' instead
			n = 0;
		}
	}

	if ((n > 0) && ((size_t)n == vec->len)) {
		if ((a < 256) && (b < 256) && (c < 256) && (d < 256) && (slash < 33)) {
			/* IPv4 format */
			if (sa->sa.sa_family == AF_INET) {
				uint32_t ip = ntohl(sa->sin.sin_addr.s_addr);
				uint32_t net = ((uint32_t)a << 24) | ((uint32_t)b << 16)
				               | ((uint32_t)c << 8) | (uint32_t)d;
				uint32_t mask = slash ? (0xFFFFFFFFu << (32 - slash)) : 0;
				return (ip & mask) == net;
			}
			return 0;
		}
	}
#if defined(USE_IPV6)
	else {
		char ad[50];
		const char *p;

		if (sscanf(vec->ptr, "[%49[^]]]/%u%n", ad, &slash, &n) != 2) {
			slash = 128;
			if (sscanf(vec->ptr, "[%49[^]]]%n", ad, &n) != 1) {
				n = 0;
			}
		}

		if ((n <= 0) && no_strict) {
			/* no square brackets? */
			p = strchr(vec->ptr, '/');
			if (p && (p < (vec->ptr + vec->len))) {
				if (((size_t)(p - vec->ptr) < sizeof(ad))
				    && (sscanf(p, "/%u%n", &slash, &n) == 1)) {
					n += (int)(p - vec->ptr);
					mg_strlcpy(ad, vec->ptr, (size_t)(p - vec->ptr) + 1);
				} else {
					n = 0;
				}
			} else if (vec->len < sizeof(ad)) {
				n = (int)vec->len;
				slash = 128;
				mg_strlcpy(ad, vec->ptr, vec->len + 1);
			}
		}

		if ((n > 0) && ((size_t)n == vec->len) && (slash < 129)) {
			p = ad;
			c = 0;
			/* zone indexes are unsupported, at least two colons are needed */
			while (isxdigit((unsigned char)*p) || (*p == '.') || (*p == ':')) {
				if (*(p++) == ':') {
					c++;
				}
			}
			if ((*p == '\0') && (c >= 2)) {
				struct sockaddr_in6 sin6;
				unsigned int i;

				/* for strict validation, an actual IPv6 argument is needed */
				if (sa->sa.sa_family != AF_INET6) {
					return 0;
				}
				if (mg_inet_pton(AF_INET6, ad, &sin6, sizeof(sin6), 0)) {
					/* IPv6 format */
					for (i = 0; i < 16; i++) {
						uint8_t ip = sa->sin6.sin6_addr.s6_addr[i];
						uint8_t net = sin6.sin6_addr.s6_addr[i];
						uint8_t mask = 0;

						if (8 * i + 8 < slash) {
							mask = 0xFFu;
						} else if (8 * i < slash) {
							mask = (uint8_t)(0xFFu << (8 * i + 8 - slash));
						}
						if ((ip & mask) != net) {
							return 0;
						}
					}
					return 1;
				}
			}
		}
	}
#else
	(void)no_strict;
#endif

	/* malformed */
	return -1;
}